

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O0

bool tinyusdz::prim::ReconstructPrim<tinyusdz::SkelAnimation>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               SkelAnimation *skelanim,string *warn,string *err,PrimReconstructOptions *options)

{
  bool bVar1;
  string *psVar2;
  size_type sVar3;
  Property *pPVar4;
  mapped_type *this;
  ostream *poVar5;
  TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
  *in_stack_ffffffffffffee78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1118 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10f8 [32];
  string local_10d8 [32];
  ostringstream local_10b8 [8];
  ostringstream ss_e_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f30 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f10 [39];
  allocator local_ee9;
  string local_ee8 [32];
  string local_ec8;
  ostringstream local_ea8 [8];
  ostringstream ss_e_5;
  allocator local_d29;
  undefined1 local_d28 [32];
  undefined1 local_d08 [40];
  ParseResult ret_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ca0 [39];
  allocator local_c79;
  string local_c78 [32];
  string local_c58;
  ostringstream local_c38 [8];
  ostringstream ss_e_4;
  allocator local_ab9;
  undefined1 local_ab8 [32];
  undefined1 local_a98 [40];
  ParseResult ret_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a30 [39];
  allocator local_a09;
  string local_a08 [32];
  string local_9e8;
  ostringstream local_9c8 [8];
  ostringstream ss_e_3;
  allocator local_849;
  undefined1 local_848 [32];
  undefined1 local_828 [32];
  undefined1 local_808 [8];
  ParseResult ret_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c0 [39];
  allocator local_799;
  string local_798 [32];
  string local_778;
  ostringstream local_758 [8];
  ostringstream ss_e_2;
  allocator local_5d9;
  undefined1 local_5d8 [32];
  undefined1 local_5b8 [32];
  undefined1 local_598 [8];
  ParseResult ret_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550 [39];
  allocator local_529;
  string local_528 [32];
  string local_508;
  ostringstream local_4e8 [8];
  ostringstream ss_e_1;
  allocator local_369;
  undefined1 local_368 [32];
  undefined1 local_348 [32];
  undefined1 local_328 [8];
  ParseResult ret_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0 [39];
  allocator local_2b9;
  string local_2b8 [32];
  string local_298;
  ostringstream local_278 [8];
  ostringstream ss_e;
  undefined4 local_100;
  allocator local_f9;
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [8];
  ParseResult ret;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>
  *prop;
  const_iterator __end2;
  const_iterator __begin2;
  PropertyMap *__range2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  string *err_local;
  string *warn_local;
  SkelAnimation *skelanim_local;
  ReferenceList *references_local;
  PropertyMap *properties_local;
  Specifier *spec_local;
  
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)err;
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&__range2);
  __end2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                    *)properties);
  prop = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>
          *)::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
            ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                   *)properties);
  do {
    bVar1 = ::std::operator!=(&__end2,(_Self *)&prop);
    if (!bVar1) {
      spec_local._7_1_ = 1;
LAB_002ab0a0:
      ::std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range2);
      return (bool)(spec_local._7_1_ & 1);
    }
    ret.err.field_2._8_8_ =
         ::std::
         _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
         ::operator*(&__end2);
    ::std::__cxx11::string::string((string *)local_d8,(string *)ret.err.field_2._8_8_);
    psVar2 = (string *)(ret.err.field_2._8_8_ + 0x20);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)local_f8,"joints",&local_f9);
    pPVar4 = (Property *)local_f8;
    (anonymous_namespace)::
    ParseTypedAttribute<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
              ((ParseResult *)local_b8,(_anonymous_namespace_ *)&__range2,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_d8,psVar2,pPVar4,(string *)&skelanim->joints,
               (TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *)
               in_stack_ffffffffffffee78);
    ::std::__cxx11::string::~string((string *)local_f8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    ::std::__cxx11::string::~string((string *)local_d8);
    if ((local_b8._0_4_ == Success) || (local_b8._0_4_ == AlreadyProcessed)) {
      local_100 = 3;
    }
    else if (local_b8._0_4_ == Unmatched) {
      local_100 = _S_red;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_278);
      poVar5 = ::std::operator<<((ostream *)local_278,"[error]");
      poVar5 = ::std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                );
      poVar5 = ::std::operator<<(poVar5,":");
      poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
      poVar5 = ::std::operator<<(poVar5,"():");
      poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xbaf);
      ::std::operator<<(poVar5," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_2b8,"Parsing attribute `{}` failed. Error: {}",&local_2b9);
      fmt::format<char[7],std::__cxx11::string>
                (&local_298,(fmt *)local_2b8,(string *)"joints",(char (*) [7])&ret,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar4);
      poVar5 = ::std::operator<<((ostream *)local_278,(string *)&local_298);
      ::std::operator<<(poVar5,"\n");
      ::std::__cxx11::string::~string((string *)&local_298);
      ::std::__cxx11::string::~string(local_2b8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
      if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(local_2e0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (ret_1.err.field_2._M_local_buf + 8));
        ::std::__cxx11::string::operator=
                  ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (string *)local_2e0);
        ::std::__cxx11::string::~string((string *)local_2e0);
        ::std::__cxx11::string::~string((string *)(ret_1.err.field_2._M_local_buf + 8));
      }
      spec_local._7_1_ = 0;
      local_100 = _S_black;
      ::std::__cxx11::ostringstream::~ostringstream(local_278);
    }
    anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_b8);
    if (local_100 == _S_red) {
      ::std::__cxx11::string::string((string *)local_348,(string *)ret.err.field_2._8_8_);
      psVar2 = (string *)(ret.err.field_2._8_8_ + 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)local_368,"translations",&local_369);
      pPVar4 = (Property *)local_368;
      (anonymous_namespace)::
      ParseTypedAttribute<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                ((ParseResult *)local_328,(_anonymous_namespace_ *)&__range2,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_348,psVar2,pPVar4,(string *)&skelanim->translations,
                 in_stack_ffffffffffffee78);
      ::std::__cxx11::string::~string((string *)local_368);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_369);
      ::std::__cxx11::string::~string((string *)local_348);
      if ((local_328._0_4_ == Success) || (local_328._0_4_ == AlreadyProcessed)) {
        local_100 = 3;
      }
      else if (local_328._0_4_ == Unmatched) {
        local_100 = _S_red;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_4e8);
        poVar5 = ::std::operator<<((ostream *)local_4e8,"[error]");
        poVar5 = ::std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar5 = ::std::operator<<(poVar5,":");
        poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
        poVar5 = ::std::operator<<(poVar5,"():");
        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xbb0);
        ::std::operator<<(poVar5," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_528,"Parsing attribute `{}` failed. Error: {}",&local_529);
        fmt::format<char[13],std::__cxx11::string>
                  (&local_508,(fmt *)local_528,(string *)"translations",(char (*) [13])&ret_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar4);
        poVar5 = ::std::operator<<((ostream *)local_4e8,(string *)&local_508);
        ::std::operator<<(poVar5,"\n");
        ::std::__cxx11::string::~string((string *)&local_508);
        ::std::__cxx11::string::~string(local_528);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_529);
        if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_550,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (ret_2.err.field_2._M_local_buf + 8));
          ::std::__cxx11::string::operator=
                    ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)local_550);
          ::std::__cxx11::string::~string((string *)local_550);
          ::std::__cxx11::string::~string((string *)(ret_2.err.field_2._M_local_buf + 8));
        }
        spec_local._7_1_ = 0;
        local_100 = _S_black;
        ::std::__cxx11::ostringstream::~ostringstream(local_4e8);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_328);
      if (local_100 != _S_red) goto joined_r0x002aac31;
      ::std::__cxx11::string::string((string *)local_5b8,(string *)ret.err.field_2._8_8_);
      psVar2 = (string *)(ret.err.field_2._8_8_ + 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)local_5d8,"rotations",&local_5d9);
      pPVar4 = (Property *)local_5d8;
      (anonymous_namespace)::
      ParseTypedAttribute<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
                ((ParseResult *)local_598,(_anonymous_namespace_ *)&__range2,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_5b8,psVar2,pPVar4,(string *)&skelanim->rotations,
                 (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                  *)in_stack_ffffffffffffee78);
      ::std::__cxx11::string::~string((string *)local_5d8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
      ::std::__cxx11::string::~string((string *)local_5b8);
      if ((local_598._0_4_ == Success) || (local_598._0_4_ == AlreadyProcessed)) {
        local_100 = 3;
      }
      else if (local_598._0_4_ == Unmatched) {
        local_100 = _S_red;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_758);
        poVar5 = ::std::operator<<((ostream *)local_758,"[error]");
        poVar5 = ::std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar5 = ::std::operator<<(poVar5,":");
        poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
        poVar5 = ::std::operator<<(poVar5,"():");
        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xbb1);
        ::std::operator<<(poVar5," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_798,"Parsing attribute `{}` failed. Error: {}",&local_799);
        fmt::format<char[10],std::__cxx11::string>
                  (&local_778,(fmt *)local_798,(string *)"rotations",(char (*) [10])&ret_2,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar4);
        poVar5 = ::std::operator<<((ostream *)local_758,(string *)&local_778);
        ::std::operator<<(poVar5,"\n");
        ::std::__cxx11::string::~string((string *)&local_778);
        ::std::__cxx11::string::~string(local_798);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_799);
        if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_7c0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (ret_3.err.field_2._M_local_buf + 8));
          ::std::__cxx11::string::operator=
                    ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)local_7c0);
          ::std::__cxx11::string::~string((string *)local_7c0);
          ::std::__cxx11::string::~string((string *)(ret_3.err.field_2._M_local_buf + 8));
        }
        spec_local._7_1_ = 0;
        local_100 = _S_black;
        ::std::__cxx11::ostringstream::~ostringstream(local_758);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_598);
      if (local_100 != _S_red) goto joined_r0x002aac31;
      ::std::__cxx11::string::string((string *)local_828,(string *)ret.err.field_2._8_8_);
      psVar2 = (string *)(ret.err.field_2._8_8_ + 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)local_848,"scales",&local_849);
      pPVar4 = (Property *)local_848;
      (anonymous_namespace)::
      ParseTypedAttribute<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
                ((ParseResult *)local_808,(_anonymous_namespace_ *)&__range2,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_828,psVar2,pPVar4,(string *)&skelanim->scales,
                 (TypedAttribute<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                  *)in_stack_ffffffffffffee78);
      ::std::__cxx11::string::~string((string *)local_848);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_849);
      ::std::__cxx11::string::~string((string *)local_828);
      if ((local_808._0_4_ == Success) || (local_808._0_4_ == AlreadyProcessed)) {
        local_100 = 3;
      }
      else if (local_808._0_4_ == Unmatched) {
        local_100 = _S_red;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_9c8);
        poVar5 = ::std::operator<<((ostream *)local_9c8,"[error]");
        poVar5 = ::std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar5 = ::std::operator<<(poVar5,":");
        poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
        poVar5 = ::std::operator<<(poVar5,"():");
        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xbb2);
        ::std::operator<<(poVar5," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_a08,"Parsing attribute `{}` failed. Error: {}",&local_a09);
        fmt::format<char[7],std::__cxx11::string>
                  (&local_9e8,(fmt *)local_a08,(string *)"scales",(char (*) [7])&ret_3,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar4);
        poVar5 = ::std::operator<<((ostream *)local_9c8,(string *)&local_9e8);
        ::std::operator<<(poVar5,"\n");
        ::std::__cxx11::string::~string((string *)&local_9e8);
        ::std::__cxx11::string::~string(local_a08);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_a09);
        if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_a30,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (ret_4.err.field_2._M_local_buf + 8));
          ::std::__cxx11::string::operator=
                    ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)local_a30);
          ::std::__cxx11::string::~string((string *)local_a30);
          ::std::__cxx11::string::~string((string *)(ret_4.err.field_2._M_local_buf + 8));
        }
        spec_local._7_1_ = 0;
        local_100 = _S_black;
        ::std::__cxx11::ostringstream::~ostringstream(local_9c8);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_808);
      if (local_100 != _S_red) goto joined_r0x002aac31;
      ::std::__cxx11::string::string((string *)local_a98,(string *)ret.err.field_2._8_8_);
      psVar2 = (string *)(ret.err.field_2._8_8_ + 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)local_ab8,"blendShapes",&local_ab9);
      pPVar4 = (Property *)local_ab8;
      (anonymous_namespace)::
      ParseTypedAttribute<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                ((ParseResult *)(local_a98 + 0x20),(_anonymous_namespace_ *)&__range2,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_a98,psVar2,pPVar4,(string *)&skelanim->blendShapes,
                 (TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *)
                 in_stack_ffffffffffffee78);
      ::std::__cxx11::string::~string((string *)local_ab8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ab9);
      ::std::__cxx11::string::~string((string *)local_a98);
      if ((local_a98._32_4_ == 0) || (local_a98._32_4_ == 2)) {
        local_100 = 3;
      }
      else if (local_a98._32_4_ == 1) {
        local_100 = _S_red;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_c38);
        poVar5 = ::std::operator<<((ostream *)local_c38,"[error]");
        poVar5 = ::std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar5 = ::std::operator<<(poVar5,":");
        poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
        poVar5 = ::std::operator<<(poVar5,"():");
        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xbb3);
        ::std::operator<<(poVar5," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_c78,"Parsing attribute `{}` failed. Error: {}",&local_c79);
        fmt::format<char[12],std::__cxx11::string>
                  (&local_c58,(fmt *)local_c78,(string *)0x63b609,(char (*) [12])&ret_4,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar4);
        poVar5 = ::std::operator<<((ostream *)local_c38,(string *)&local_c58);
        ::std::operator<<(poVar5,"\n");
        ::std::__cxx11::string::~string((string *)&local_c58);
        ::std::__cxx11::string::~string(local_c78);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_c79);
        if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_ca0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (ret_5.err.field_2._M_local_buf + 8));
          ::std::__cxx11::string::operator=
                    ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)local_ca0);
          ::std::__cxx11::string::~string((string *)local_ca0);
          ::std::__cxx11::string::~string((string *)(ret_5.err.field_2._M_local_buf + 8));
        }
        spec_local._7_1_ = 0;
        local_100 = _S_black;
        ::std::__cxx11::ostringstream::~ostringstream(local_c38);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)(local_a98 + 0x20));
      if (local_100 != _S_red) goto joined_r0x002aac31;
      ::std::__cxx11::string::string((string *)local_d08,(string *)ret.err.field_2._8_8_);
      psVar2 = (string *)(ret.err.field_2._8_8_ + 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)local_d28,"blendShapeWeights",&local_d29);
      pPVar4 = (Property *)local_d28;
      (anonymous_namespace)::ParseTypedAttribute<std::vector<float,std::allocator<float>>>
                ((ParseResult *)(local_d08 + 0x20),(_anonymous_namespace_ *)&__range2,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_d08,psVar2,pPVar4,(string *)&skelanim->blendShapeWeights,
                 (TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>
                  *)in_stack_ffffffffffffee78);
      ::std::__cxx11::string::~string((string *)local_d28);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_d29);
      ::std::__cxx11::string::~string((string *)local_d08);
      if ((local_d08._32_4_ == 0) || (local_d08._32_4_ == 2)) {
        local_100 = 3;
      }
      else if (local_d08._32_4_ == 1) {
        local_100 = _S_red;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_ea8);
        poVar5 = ::std::operator<<((ostream *)local_ea8,"[error]");
        poVar5 = ::std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar5 = ::std::operator<<(poVar5,":");
        poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
        poVar5 = ::std::operator<<(poVar5,"():");
        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xbb4);
        ::std::operator<<(poVar5," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_ee8,"Parsing attribute `{}` failed. Error: {}",&local_ee9);
        fmt::format<char[18],std::__cxx11::string>
                  (&local_ec8,(fmt *)local_ee8,(string *)"blendShapeWeights",(char (*) [18])&ret_5,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar4);
        poVar5 = ::std::operator<<((ostream *)local_ea8,(string *)&local_ec8);
        ::std::operator<<(poVar5,"\n");
        ::std::__cxx11::string::~string((string *)&local_ec8);
        ::std::__cxx11::string::~string(local_ee8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_ee9);
        if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_f10,local_f30);
          ::std::__cxx11::string::operator=
                    ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)local_f10);
          ::std::__cxx11::string::~string((string *)local_f10);
          ::std::__cxx11::string::~string((string *)local_f30);
        }
        spec_local._7_1_ = 0;
        local_100 = _S_black;
        ::std::__cxx11::ostringstream::~ostringstream(local_ea8);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)(local_d08 + 0x20));
      if (local_100 != _S_red) goto joined_r0x002aac31;
      sVar3 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range2,(key_type *)ret.err.field_2._8_8_);
      if (sVar3 == 0) {
        pPVar4 = (Property *)(ret.err.field_2._8_8_ + 0x20);
        this = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                             *)&skelanim->props,(key_type *)ret.err.field_2._8_8_);
        Property::operator=(this,pPVar4);
        ::std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range2,(value_type *)ret.err.field_2._8_8_);
      }
      sVar3 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range2,(key_type *)ret.err.field_2._8_8_);
      if (sVar3 == 0) {
        ::std::__cxx11::ostringstream::ostringstream(local_10b8);
        poVar5 = ::std::operator<<((ostream *)local_10b8,"[error]");
        poVar5 = ::std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar5 = ::std::operator<<(poVar5,":");
        poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
        poVar5 = ::std::operator<<(poVar5,"():");
        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xbb6);
        ::std::operator<<(poVar5," ");
        ::std::operator+((char *)local_10d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "Unsupported/unimplemented property: ");
        poVar5 = ::std::operator<<((ostream *)local_10b8,local_10d8);
        ::std::operator<<(poVar5,"\n");
        ::std::__cxx11::string::~string(local_10d8);
        if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_10f8,local_1118);
          ::std::__cxx11::string::operator=
                    ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)local_10f8);
          ::std::__cxx11::string::~string((string *)local_10f8);
          ::std::__cxx11::string::~string((string *)local_1118);
        }
        spec_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_10b8);
        goto LAB_002ab0a0;
      }
    }
    else {
joined_r0x002aac31:
      if (local_100 != 3) goto LAB_002ab0a0;
    }
    ::std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

bool ReconstructPrim<SkelAnimation>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    SkelAnimation *skelanim,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)spec;
  (void)warn;
  (void)references;
  (void)options;
  std::set<std::string> table;
  for (auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "joints", SkelAnimation, skelanim->joints)
    PARSE_TYPED_ATTRIBUTE(table, prop, "translations", SkelAnimation, skelanim->translations)
    PARSE_TYPED_ATTRIBUTE(table, prop, "rotations", SkelAnimation, skelanim->rotations)
    PARSE_TYPED_ATTRIBUTE(table, prop, "scales", SkelAnimation, skelanim->scales)
    PARSE_TYPED_ATTRIBUTE(table, prop, "blendShapes", SkelAnimation, skelanim->blendShapes)
    PARSE_TYPED_ATTRIBUTE(table, prop, "blendShapeWeights", SkelAnimation, skelanim->blendShapeWeights)
    ADD_PROPERTY(table, prop, Skeleton, skelanim->props)
    PARSE_PROPERTY_END_MAKE_ERROR(table, prop)
  }

  return true;
}